

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_parameters ZVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_CCtx_params ret;
  ZSTD_CCtx_params in_stack_fffffffffffffec8;
  undefined1 local_a8 [12];
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  ZSTD_strategy ZStack_8c;
  ZSTD_frameParameters local_88;
  undefined4 local_7c;
  
  ZVar1 = params;
  bVar6 = 0;
  memcpy(local_a8,&cctx->requestedParams,0x80);
  local_a8._4_4_ = params.cParams.windowLog;
  local_a8._8_4_ = params.cParams.chainLog;
  uStack_9c = ZVar1.cParams.hashLog;
  uStack_98 = ZVar1.cParams.searchLog;
  uStack_94 = ZVar1.cParams.minMatch;
  uStack_90 = params.cParams.targetLength;
  ZStack_8c = params.cParams.strategy;
  local_88.contentSizeFlag = params.fParams.contentSizeFlag;
  local_88.checksumFlag = params.fParams.checksumFlag;
  local_88.noDictIDFlag = params.fParams.noDictIDFlag;
  local_7c = 3;
  puVar4 = (undefined8 *)local_a8;
  puVar5 = (undefined8 *)&stack0xfffffffffffffec8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  sVar2 = ZSTD_compressBegin_advanced_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,
                     in_stack_fffffffffffffec8,pledgedSrcSize);
  return sVar2;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            cctxParams, pledgedSrcSize);
}